

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5DoclistIterNext(Fts5DoclistIter *pIter)

{
  byte bVar1;
  int iVar2;
  u32 local_24;
  u64 uStack_20;
  int nPos;
  i64 iDelta;
  u8 *p;
  Fts5DoclistIter *pIter_local;
  
  iDelta = (i64)(pIter->aPoslist + (long)pIter->nPoslist + (long)pIter->nSize);
  if ((ulong)iDelta < pIter->aEof) {
    p = (u8 *)pIter;
    bVar1 = sqlite3Fts5GetVarint((uchar *)iDelta,&stack0xffffffffffffffe0);
    iDelta = iDelta + (int)(uint)bVar1;
    *(u64 *)(p + 8) = uStack_20 + *(long *)(p + 8);
    if ((*(byte *)iDelta & 0x80) == 0) {
      *(int *)(p + 0x18) = (int)(uint)*(byte *)iDelta >> 1;
      p[0x1c] = '\x01';
      p[0x1d] = '\0';
      p[0x1e] = '\0';
      p[0x1f] = '\0';
    }
    else {
      iVar2 = sqlite3Fts5GetVarint32((uchar *)iDelta,&local_24);
      *(int *)(p + 0x1c) = iVar2;
      *(int *)(p + 0x18) = (int)local_24 >> 1;
    }
    *(i64 *)(p + 0x10) = iDelta;
  }
  else {
    pIter->aPoslist = (u8 *)0x0;
  }
  return;
}

Assistant:

static void fts5DoclistIterNext(Fts5DoclistIter *pIter){
  u8 *p = pIter->aPoslist + pIter->nSize + pIter->nPoslist;

  assert( pIter->aPoslist );
  if( p>=pIter->aEof ){
    pIter->aPoslist = 0;
  }else{
    i64 iDelta;

    p += fts5GetVarint(p, (u64*)&iDelta);
    pIter->iRowid += iDelta;

    /* Read position list size */
    if( p[0] & 0x80 ){
      int nPos;
      pIter->nSize = fts5GetVarint32(p, nPos);
      pIter->nPoslist = (nPos>>1);
    }else{
      pIter->nPoslist = ((int)(p[0])) >> 1;
      pIter->nSize = 1;
    }

    pIter->aPoslist = p;
  }
}